

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O1

void __thiscall snmalloc::LocalEntropy::init<snmalloc::PALLinux>(LocalEntropy *this)

{
  uint64_t uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = PALLinux::get_entropy64();
  this->local_key = uVar1;
  uVar1 = PALLinux::get_entropy64();
  uVar2 = uVar1 + 1;
  this->local_counter = uVar2;
  iVar3 = 1;
  do {
    uVar2 = ((uVar2 & 0xfffffffff) * this->local_key ^ uVar2) >> 0x20 | uVar2 << 0x20;
    iVar3 = iVar3 + -1;
  } while (iVar3 == 0);
  this->bit_source = uVar2;
  return;
}

Assistant:

void init()
    {
      local_key = get_entropy64<PAL>();
      local_counter = get_entropy64<PAL>();
      bit_source = get_next();
    }